

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QHostAddress::isInSubnet(QHostAddress *this,QHostAddress *subnet,int netmask)

{
  byte bVar1;
  NetworkLayerProtocol NVar2;
  int iVar3;
  QHostAddressPrivate *pQVar4;
  uint in_EDX;
  long in_FS_OFFSET;
  quint8 netbyte;
  quint8 ipbyte;
  quint8 bytemask;
  quint8 *net;
  quint8 *ip;
  anon_union_4_2_e7985e1e net4;
  anon_union_4_2_e7985e1e ip4;
  anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *local_40;
  anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *local_38;
  uint local_2c;
  bool local_11;
  undefined1 local_10 [16];
  
  local_10._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  NVar2 = protocol((QHostAddress *)0x217ac8);
  pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217ad6);
  if ((NVar2 == pQVar4->protocol) && (-1 < (int)in_EDX)) {
    local_10._4_4_ = 0xaaaaaaaa;
    local_10._0_4_ = 0xaaaaaaaa;
    pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217b32);
    local_2c = in_EDX;
    if (pQVar4->protocol == '\0') {
      if (0x20 < (int)in_EDX) {
        local_2c = 0x20;
      }
      QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217b54);
      local_10._4_4_ = qToBigEndian<unsigned_int>(0);
      QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217b6a);
      local_10._0_4_ = qToBigEndian<unsigned_int>(0);
      local_38 = (anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *)(local_10 + 4);
      local_40 = (anon_union_16_3_7ae2c192_for_QHostAddressPrivate_2 *)local_10;
    }
    else {
      pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217b96);
      if (pQVar4->protocol != '\x01') {
        local_11 = false;
        goto LAB_00217cc2;
      }
      if (0x80 < (int)in_EDX) {
        local_2c = 0x80;
      }
      pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217bbb);
      local_38 = &pQVar4->field_1;
      pQVar4 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217bce);
      local_40 = &pQVar4->field_1;
    }
    if (7 < (int)local_2c) {
      iVar3 = memcmp(local_38,local_40,(long)((int)local_2c / 8));
      if (iVar3 != 0) {
        local_11 = false;
        goto LAB_00217cc2;
      }
    }
    if ((local_2c & 7) == 0) {
      local_11 = true;
    }
    else {
      bVar1 = -(char)(1 << (8 - ((byte)local_2c & 7) & 0x1f));
      local_11 = (*(byte *)((long)local_38 + (long)((int)local_2c / 8)) & bVar1) ==
                 (*(byte *)((long)local_40 + (long)((int)local_2c / 8)) & bVar1);
    }
  }
  else {
    local_11 = false;
  }
LAB_00217cc2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10._8_8_) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QHostAddress::isInSubnet(const QHostAddress &subnet, int netmask) const
{
    if (subnet.protocol() != d->protocol || netmask < 0)
        return false;

    union {
        quint32 ip;
        quint8 data[4];
    } ip4, net4;
    const quint8 *ip;
    const quint8 *net;
    if (d->protocol == QHostAddress::IPv4Protocol) {
        if (netmask > 32)
            netmask = 32;
        ip4.ip = qToBigEndian(d->a);
        net4.ip = qToBigEndian(subnet.d->a);
        ip = ip4.data;
        net = net4.data;
    } else if (d->protocol == QHostAddress::IPv6Protocol) {
        if (netmask > 128)
            netmask = 128;
        ip = d->a6.c;
        net = subnet.d->a6.c;
    } else {
        return false;
    }

    if (netmask >= 8 && memcmp(ip, net, netmask / 8) != 0)
        return false;
    if ((netmask & 7) == 0)
        return true;

    // compare the last octet now
    quint8 bytemask = 256 - (1 << (8 - (netmask & 7)));
    quint8 ipbyte = ip[netmask / 8];
    quint8 netbyte = net[netmask / 8];
    return (ipbyte & bytemask) == (netbyte & bytemask);
}